

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlreader.c
# Opt level: O1

int xmlTextReaderMoveToAttributeNo(xmlTextReaderPtr reader,int no)

{
  xmlNodePtr pxVar1;
  xmlNodePtr pxVar2;
  int iVar3;
  int iVar4;
  
  if (((reader == (xmlTextReaderPtr)0x0) || (pxVar1 = reader->node, pxVar1 == (xmlNodePtr)0x0)) ||
     (pxVar1->type != XML_ELEMENT_NODE)) {
    return -1;
  }
  reader->curnode = (xmlNodePtr)0x0;
  pxVar2 = (xmlNodePtr)&pxVar1->nsDef;
  iVar4 = -1;
  do {
    iVar4 = iVar4 + 1;
    pxVar2 = (xmlNodePtr)pxVar2->_private;
    if (no <= iVar4) break;
  } while (pxVar2 != (xmlNodePtr)0x0);
  if (pxVar2 == (xmlNodePtr)0x0) {
    pxVar2 = (xmlNodePtr)pxVar1->properties;
    if (pxVar2 == (xmlNodePtr)0x0) {
      return 0;
    }
    iVar3 = no - iVar4;
    if (iVar3 != 0 && iVar4 <= no) {
      do {
        pxVar2 = pxVar2->next;
        if (pxVar2 == (_xmlNode *)0x0) {
          return 0;
        }
        iVar3 = iVar3 + -1;
      } while (iVar3 != 0);
    }
  }
  reader->curnode = pxVar2;
  return 1;
}

Assistant:

int
xmlTextReaderMoveToAttributeNo(xmlTextReaderPtr reader, int no) {
    int i;
    xmlAttrPtr cur;
    xmlNsPtr ns;

    if (reader == NULL)
	return(-1);
    if (reader->node == NULL)
	return(-1);
    /* TODO: handle the xmlDecl */
    if (reader->node->type != XML_ELEMENT_NODE)
	return(-1);

    reader->curnode = NULL;

    ns = reader->node->nsDef;
    for (i = 0;(i < no) && (ns != NULL);i++) {
	ns = ns->next;
    }
    if (ns != NULL) {
	reader->curnode = (xmlNodePtr) ns;
	return(1);
    }

    cur = reader->node->properties;
    if (cur == NULL)
	return(0);
    for (;i < no;i++) {
	cur = cur->next;
	if (cur == NULL)
	    return(0);
    }
    /* TODO walk the DTD if present */

    reader->curnode = (xmlNodePtr) cur;
    return(1);
}